

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * testing::internal::AppendUserMessage
                   (string *__return_storage_ptr__,string *gtest_msg,Message *user_msg)

{
  string *psVar1;
  string user_msg_string;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  string local_38;
  
  Message::GetString_abi_cxx11_(&local_38,user_msg);
  psVar1 = gtest_msg;
  if ((local_38._M_string_length == 0) || (psVar1 = &local_38, gtest_msg->_M_string_length == 0)) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar1);
  }
  else {
    std::operator+(&bStack_58,gtest_msg,"\n");
    std::operator+(__return_storage_ptr__,&bStack_58,&local_38);
    std::__cxx11::string::~string((string *)&bStack_58);
  }
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string AppendUserMessage(const std::string& gtest_msg,
                              const Message& user_msg) {
  // Appends the user message if it's non-empty.
  const std::string user_msg_string = user_msg.GetString();
  if (user_msg_string.empty()) {
    return gtest_msg;
  }
  if (gtest_msg.empty()) {
    return user_msg_string;
  }
  return gtest_msg + "\n" + user_msg_string;
}